

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxTree.cpp
# Opt level: O2

shared_ptr<slang::syntax::SyntaxTree>
slang::syntax::SyntaxTree::create
          (SourceManager *sourceManager,
          span<const_slang::SourceBuffer,_18446744073709551615UL> sources,Bag *options,
          MacroList inheritedMacros,bool guess)

{
  span<const_slang::syntax::DefineDirectiveSyntax_*const,_18446744073709551615UL> inheritedMacros_00
  ;
  invalid_argument *piVar1;
  CompilationUnitSyntax *root;
  SyntaxTree *this;
  ParserMetadata *metadata;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  SourceLibrary *library;
  pointer pSVar2;
  bool bVar3;
  bool bVar4;
  shared_ptr<slang::syntax::SyntaxTree> sVar5;
  string_view name;
  span<const_slang::SourceBuffer,_18446744073709551615UL> sources_00;
  MacroList inheritedMacros_01;
  function_ref<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  detail;
  undefined7 in_stack_00000009;
  __extent_storage<18446744073709551615UL> in_stack_00000010;
  TimeTraceScope timeScope;
  span<const_slang::SourceBuffer,_18446744073709551615UL> sources_local;
  BumpAllocator alloc;
  _Vector_base<const_slang::syntax::DefineDirectiveSyntax_*,_std::allocator<const_slang::syntax::DefineDirectiveSyntax_*>_>
  local_880;
  table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::type_index,_void>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
  local_868;
  Diagnostics diagnostics;
  Parser parser;
  Preprocessor preprocessor;
  
  inheritedMacros_01._M_ptr =
       (table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::type_index,_void>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
        *)inheritedMacros._M_ptr;
  sources_local._M_ptr = (pointer)sources._M_extent._M_extent_value;
  sources_00._M_ptr = (SyntaxTree *)sources._M_ptr;
  sources_local._M_extent._M_extent_value = (size_t)options;
  if (options == (Bag *)0x0) {
    piVar1 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar1,"sources cannot be empty");
    __cxa_throw(piVar1,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  preprocessor.sourceManager = (SourceManager *)&sources_local;
  name._M_str = "parseFile";
  name._M_len = 9;
  detail.callable = (intptr_t)&preprocessor;
  detail.callback =
       function_ref<std::__cxx11::string()>::
       callback_fn<slang::syntax::SyntaxTree::create(slang::SourceManager&,std::span<slang::SourceBuffer_const,18446744073709551615ul>,slang::Bag_const&,std::span<slang::syntax::DefineDirectiveSyntax_const*const,18446744073709551615ul>,bool)::__0>
  ;
  preprocessor.alloc = (BumpAllocator *)sources_00._M_ptr;
  TimeTraceScope::TimeTraceScope(&timeScope,name,detail);
  BumpAllocator::BumpAllocator(&alloc);
  diagnostics.super_SmallVector<slang::Diagnostic,_2UL>.super_SmallVectorBase<slang::Diagnostic>.
  data_ = (pointer)diagnostics.super_SmallVector<slang::Diagnostic,_2UL>.
                   super_SmallVectorBase<slang::Diagnostic>.firstElement;
  diagnostics.super_SmallVector<slang::Diagnostic,_2UL>.super_SmallVectorBase<slang::Diagnostic>.len
       = 0;
  diagnostics.super_SmallVector<slang::Diagnostic,_2UL>.super_SmallVectorBase<slang::Diagnostic>.cap
       = 2;
  inheritedMacros_00._M_ptr._1_7_ = in_stack_00000009;
  inheritedMacros_00._M_ptr._0_1_ = guess;
  inheritedMacros_00._M_extent._M_extent_value = in_stack_00000010._M_extent_value;
  parsing::Preprocessor::Preprocessor
            (&preprocessor,(SourceManager *)sources_00._M_ptr,&alloc,&diagnostics,
             (Bag *)inheritedMacros_01._M_ptr,inheritedMacros_00);
  library = (SourceLibrary *)0x0;
  pSVar2 = sources_local._M_ptr + sources_local._M_extent._M_extent_value;
  while (pSVar2 != sources_local._M_ptr) {
    parsing::Preprocessor::pushSource(&preprocessor,pSVar2[-1]);
    bVar3 = pSVar2 != sources_local._M_ptr + sources_local._M_extent._M_extent_value;
    bVar4 = library != pSVar2[-1].library;
    library = pSVar2[-1].library;
    pSVar2 = pSVar2 + -1;
    if (bVar4 && bVar3) {
      piVar1 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument
                (piVar1,
                 "All sources provided to a single SyntaxTree must be from the same source library")
      ;
      __cxa_throw(piVar1,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
  }
  parsing::Parser::Parser(&parser,&preprocessor,(Bag *)inheritedMacros_01._M_ptr);
  if ((char)inheritedMacros._M_extent._M_extent_value == '\0') {
    root = parsing::Parser::parseCompilationUnit(&parser);
  }
  else {
    root = (CompilationUnitSyntax *)parsing::Parser::parseGuess(&parser);
    bVar3 = parsing::Parser::isDone(&parser);
    if (!bVar3) {
      sources_00._M_extent._M_extent_value = (size_t)sources_local._M_ptr;
      inheritedMacros_01._M_extent._M_extent_value = 0;
      create(sourceManager,sources_00,(Bag *)sources_local._M_extent._M_extent_value,
             inheritedMacros_01,guess);
      this = sources_00._M_ptr;
      goto LAB_001a7d03;
    }
  }
  this = (SyntaxTree *)operator_new(0x178);
  metadata = parsing::Parser::getMetadata(&parser);
  parsing::Preprocessor::getDefinedMacros
            ((vector<const_slang::syntax::DefineDirectiveSyntax_*,_std::allocator<const_slang::syntax::DefineDirectiveSyntax_*>_>
              *)&local_880,&preprocessor);
  boost::unordered::detail::foa::
  table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::type_index,_void>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
  ::table_core(&local_868,inheritedMacros_01._M_ptr);
  SyntaxTree(this,&root->super_SyntaxNode,library,(SourceManager *)sources_00._M_ptr,&alloc,
             &diagnostics,metadata,
             (vector<const_slang::syntax::DefineDirectiveSyntax_*,_std::allocator<const_slang::syntax::DefineDirectiveSyntax_*>_>
              *)&local_880,(Bag *)&local_868);
  std::__shared_ptr<slang::syntax::SyntaxTree,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<slang::syntax::SyntaxTree,void>
            ((__shared_ptr<slang::syntax::SyntaxTree,(__gnu_cxx::_Lock_policy)2> *)sourceManager,
             this);
  boost::unordered::detail::foa::
  table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::type_index,_void>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
  ::~table_core(&local_868);
  std::
  _Vector_base<const_slang::syntax::DefineDirectiveSyntax_*,_std::allocator<const_slang::syntax::DefineDirectiveSyntax_*>_>
  ::~_Vector_base(&local_880);
LAB_001a7d03:
  parsing::Parser::~Parser(&parser);
  parsing::Preprocessor::~Preprocessor(&preprocessor);
  SmallVectorBase<slang::Diagnostic>::cleanup
            ((SmallVectorBase<slang::Diagnostic> *)&diagnostics,(EVP_PKEY_CTX *)this);
  BumpAllocator::~BumpAllocator(&alloc);
  TimeTraceScope::~TimeTraceScope(&timeScope);
  sVar5.super___shared_ptr<slang::syntax::SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = extraout_RDX._M_pi;
  sVar5.super___shared_ptr<slang::syntax::SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)sourceManager;
  return (shared_ptr<slang::syntax::SyntaxTree>)
         sVar5.super___shared_ptr<slang::syntax::SyntaxTree,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<SyntaxTree> SyntaxTree::create(SourceManager& sourceManager,
                                               std::span<const SourceBuffer> sources,
                                               const Bag& options, MacroList inheritedMacros,
                                               bool guess) {
    if (sources.empty())
        SLANG_THROW(std::invalid_argument("sources cannot be empty"));

    TimeTraceScope timeScope("parseFile"sv, [&] {
        if (sources.size() == 1)
            return std::string(sourceManager.getRawFileName(sources[0].id));
        else
            return "<multi-buffer>"s;
    });

    BumpAllocator alloc;
    Diagnostics diagnostics;
    Preprocessor preprocessor(sourceManager, alloc, diagnostics, options, inheritedMacros);

    const SourceLibrary* library = nullptr;
    for (auto it = sources.rbegin(); it != sources.rend(); it++) {
        preprocessor.pushSource(*it);

        if (it != sources.rbegin() && library != it->library) {
            SLANG_THROW(std::invalid_argument("All sources provided to a single SyntaxTree must be "
                                              "from the same source library"));
        }

        library = it->library;
    }

    Parser parser(preprocessor, options);

    SyntaxNode* root;
    if (!guess)
        root = &parser.parseCompilationUnit();
    else {
        root = &parser.parseGuess();
        if (!parser.isDone())
            return create(sourceManager, sources, options, inheritedMacros, false);
    }

    return std::shared_ptr<SyntaxTree>(
        new SyntaxTree(root, library, sourceManager, std::move(alloc), std::move(diagnostics),
                       parser.getMetadata(), preprocessor.getDefinedMacros(), options));
}